

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_encoder.h
# Opt level: O0

void __thiscall
draco::RAnsSymbolEncoder<1>::StartEncoding(RAnsSymbolEncoder<1> *this,EncoderBuffer *buffer)

{
  size_t sVar1;
  char *pcVar2;
  EncoderBuffer *in_RDI;
  uint8_t *data;
  int64_t required_bytes;
  uint64_t required_bits;
  int64_t in_stack_ffffffffffffffc8;
  
  sVar1 = EncoderBuffer::size((EncoderBuffer *)0x266982);
  *(size_t *)&in_RDI[1].buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 =
       sVar1;
  EncoderBuffer::Resize(in_RDI,in_stack_ffffffffffffffc8);
  pcVar2 = EncoderBuffer::data((EncoderBuffer *)0x2669c1);
  RAnsEncoder<12>::write_init
            ((RAnsEncoder<12> *)&in_RDI->encode_bit_sequence_size_,
             (uint8_t *)
             (pcVar2 + *(long *)&in_RDI[1].buffer_.super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.field_0x8));
  return;
}

Assistant:

void RAnsSymbolEncoder<unique_symbols_bit_length_t>::StartEncoding(
    EncoderBuffer *buffer) {
  // Allocate extra storage just in case.
  const uint64_t required_bits = 2 * num_expected_bits_ + 32;

  buffer_offset_ = buffer->size();
  const int64_t required_bytes = (required_bits + 7) / 8;
  buffer->Resize(buffer_offset_ + required_bytes + sizeof(buffer_offset_));
  uint8_t *const data =
      reinterpret_cast<uint8_t *>(const_cast<char *>(buffer->data()));
  ans_.write_init(data + buffer_offset_);
}